

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

void __thiscall GGSock::FileServer::FileServer(FileServer *this)

{
  _Base_ptr p_Var1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> __s;
  
  __s._M_head_impl = (Impl *)operator_new(0x128);
  memset(__s._M_head_impl,0,0x128);
  *(undefined8 *)&(__s._M_head_impl)->parameters = 0x800000004;
  *(undefined8 *)((long)&(__s._M_head_impl)->parameters + 8) = 0x8000000080;
  *(TPort *)((long)&(__s._M_head_impl)->parameters + 0x10) = 0x58ed;
  (__s._M_head_impl)->isRunning = (__atomic_base<bool>)0x0;
  (__s._M_head_impl)->isListening = false;
  (((_Bit_iterator *)((long)&(__s._M_head_impl)->fileUsed + 0x10))->super__Bit_iterator_base)._M_p =
       0;
  *(uint *)((long)&(__s._M_head_impl)->fileUsed + 0x18) = 0;
  p_Var1 = (_Base_ptr)((long)&(__s._M_head_impl)->fileInfos + 8);
  (((_Rb_tree_header *)((long)&(__s._M_head_impl)->fileInfos + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->fileInfos + 0x10) = (_Base_ptr)0x0;
  (__s._M_head_impl)->currentFileUpdateId = 0;
  (__s._M_head_impl)->currentClientUpdateId = 0;
  *(undefined8 *)&((__s._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_> = 0;
  *(uint *)((long)&(__s._M_head_impl)->fileUsed + 8) = 0;
  *(_Bit_pointer *)((long)&(__s._M_head_impl)->fileUsed + 0x20) = (_Bit_pointer)0x0;
  *(undefined8 *)
   &((__s._M_head_impl)->files).
    super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
       = 0;
  *(pointer *)((long)&(__s._M_head_impl)->files + 8) = (pointer)0x0;
  *(pointer *)((long)&(__s._M_head_impl)->files + 0x10) = (pointer)0x0;
  *(undefined8 *)
   &((__s._M_head_impl)->clients).
    super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> = 0;
  *(pointer *)((long)&(__s._M_head_impl)->clients + 8) = (pointer)0x0;
  *(undefined8 *)((long)&(__s._M_head_impl)->clients + 9) = 0;
  *(undefined8 *)((long)&(__s._M_head_impl)->clients + 0x11) = 0;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->fileInfos + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->fileInfos + 0x20) = p_Var1;
  *(size_t *)((long)&(__s._M_head_impl)->fileInfos + 0x28) = 0;
  (__s._M_head_impl)->changedClientInfos = false;
  p_Var1 = (_Base_ptr)((long)&(__s._M_head_impl)->clientInfos + 8);
  (((_Rb_tree_header *)((long)&(__s._M_head_impl)->clientInfos + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->clientInfos + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->clientInfos + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->clientInfos + 0x20) = p_Var1;
  *(pointer *)((long)&(__s._M_head_impl)->workers + 0x10) = (pointer)0x0;
  *(undefined8 *)
   &((__s._M_head_impl)->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_> = 0;
  *(pointer *)((long)&(__s._M_head_impl)->workers + 8) = (pointer)0x0;
  *(undefined8 *)((long)&(__s._M_head_impl)->mutex + 0x18) = 0;
  *(undefined8 *)((long)&(__s._M_head_impl)->mutex + 0x20) = 0;
  *(undefined8 *)((long)&(__s._M_head_impl)->mutex + 8) = 0;
  *(undefined8 *)((long)&(__s._M_head_impl)->mutex + 0x10) = 0;
  *(size_t *)((long)&(__s._M_head_impl)->clientInfos + 0x28) = 0;
  *(undefined8 *)&((__s._M_head_impl)->mutex).super___mutex_base = 0;
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl = __s._M_head_impl;
  return;
}

Assistant:

FileServer::FileServer() : m_impl(new Impl()) {
}